

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O0

void GradientUnfilter_C(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  uint8_t b;
  uint8_t uVar1;
  int iVar2;
  int in_ECX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  int i;
  uint8_t left;
  uint8_t top_left;
  uint8_t top;
  int local_24;
  uint8_t local_1f;
  uint8_t local_1e;
  
  if (in_RDI == (uint8_t *)0x0) {
    HorizontalUnfilter_C((uint8_t *)0x0,in_RSI,in_RDX,in_ECX);
  }
  else {
    local_1f = *in_RDI;
    local_1e = local_1f;
    for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
      b = in_RDI[local_24];
      uVar1 = in_RSI[local_24];
      iVar2 = GradientPredictor_C(local_1f,b,local_1e);
      local_1f = uVar1 + (char)iVar2;
      in_RDX[local_24] = local_1f;
      local_1e = b;
    }
  }
  return;
}

Assistant:

static void GradientUnfilter_C(const uint8_t* prev, const uint8_t* in,
                               uint8_t* out, int width) {
  if (prev == NULL) {
    HorizontalUnfilter_C(NULL, in, out, width);
  } else {
    uint8_t top = prev[0], top_left = top, left = top;
    int i;
    for (i = 0; i < width; ++i) {
      top = prev[i];  // need to read this first, in case prev==out
      left = (uint8_t)(in[i] + GradientPredictor_C(left, top, top_left));
      top_left = top;
      out[i] = left;
    }
  }
}